

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  FT_Bool FVar1;
  FT_Bool FVar2;
  int iVar3;
  PSH_Hint_conflict hint_00;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  FT_UInt FVar13;
  FT_Pos FVar14;
  FT_Pos *pFVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  FT_Pos FVar20;
  bool bVar21;
  ulong local_60;
  
  FVar13 = hint->flags;
  if ((FVar13 & 8) != 0) {
    return;
  }
  lVar19 = (long)(int)globals->dimension[(uint)dimension].scale_mult;
  iVar18 = hint->org_pos;
  uVar4 = (long)(int)((ulong)(iVar18 * lVar19 + 0x8000 + (iVar18 * lVar19 >> 0x3f)) >> 0x10) +
          globals->dimension[(uint)dimension].scale_delta;
  iVar11 = hint->org_len;
  uVar9 = iVar11 * lVar19 + 0x8000 + (iVar11 * lVar19 >> 0x3f);
  iVar8 = (int)(uVar9 >> 0x10);
  local_60 = (ulong)iVar8;
  if (dimension == 1) {
    if (glyph->do_vert_hints == '\0') {
LAB_00157787:
      hint->cur_pos = uVar4;
      hint->cur_len = local_60;
      goto LAB_00157a94;
    }
    FVar1 = glyph->do_vert_snapping;
    bVar21 = FVar1 != '\0';
    hint->cur_len = local_60;
    FVar2 = (globals->blues).no_overshoots;
    FVar13 = (globals->blues).normal_top.count;
    iVar10 = 2;
    if (FVar13 == 0) {
      FVar14 = 0;
      iVar16 = 0;
    }
    else {
      iVar10 = (globals->blues).blue_fuzz;
      pFVar15 = &(globals->blues).normal_top.zones[0].cur_ref;
      do {
        iVar16 = (iVar11 + iVar18) - *(FT_Int *)((long)pFVar15 + -4);
        if (SBORROW4(iVar16,-iVar10) != iVar16 + iVar10 < 0) break;
        if (iVar11 + iVar18 <= *(int *)(pFVar15 + -1) + iVar10) {
          if ((FVar2 != '\0') || (iVar16 <= (globals->blues).blue_threshold)) {
            FVar14 = *pFVar15;
            iVar10 = 3;
            iVar16 = 1;
            goto LAB_001578a9;
          }
          break;
        }
        pFVar15 = pFVar15 + 6;
        FVar13 = FVar13 - 1;
      } while (FVar13 != 0);
      FVar14 = 0;
      iVar16 = 0;
      iVar10 = 2;
    }
LAB_001578a9:
    uVar5 = (ulong)(globals->blues).normal_bottom.count;
    if (uVar5 == 0) {
      FVar20 = 0;
    }
    else {
      iVar3 = (globals->blues).blue_fuzz;
      pFVar15 = &(globals->blues).normal_bottom.zones[uVar5 - 1].cur_ref;
      do {
        iVar17 = *(int *)(pFVar15 + -1) - iVar18;
        if (SBORROW4(iVar17,-iVar3) != iVar17 + iVar3 < 0) break;
        if (*(FT_Int *)((long)pFVar15 + -4) - iVar3 <= iVar18) {
          if ((FVar2 == '\0') && ((globals->blues).blue_threshold <= iVar17)) {
            FVar20 = 0;
          }
          else {
            FVar20 = *pFVar15;
            iVar16 = iVar10;
          }
          goto LAB_00157953;
        }
        pFVar15 = pFVar15 + -6;
        uVar6 = (int)uVar5 - 1;
        uVar5 = (ulong)uVar6;
      } while (uVar6 != 0);
      FVar20 = 0;
    }
LAB_00157953:
    if (iVar16 == 1) {
      hint->cur_pos = FVar14 - local_60;
      if (FVar1 != '\0') {
        uVar4 = 0x40;
        if (0x3f < (long)local_60) {
          uVar4 = local_60 + 0x20 & 0x7fffffffffffffc0;
        }
        hint->cur_pos = FVar14 - uVar4;
        goto LAB_00157a8c;
      }
    }
    else if (iVar16 == 3) {
      hint->cur_pos = FVar20;
      hint->cur_len = FVar14 - FVar20;
    }
    else {
      if (iVar16 != 2) goto LAB_001576c0;
      hint->cur_pos = FVar20;
      if (FVar1 != '\0') {
        uVar4 = 0x40;
        if (0x3f < (long)local_60) {
          uVar4 = local_60 + 0x20 & 0x7fffffffffffffc0;
        }
        goto LAB_00157a8c;
      }
    }
  }
  else {
    if (dimension == 0) {
      if (glyph->do_horz_hints == '\0') goto LAB_00157787;
      bVar21 = glyph->do_horz_snapping != '\0';
    }
    else {
      bVar21 = false;
    }
    hint->cur_len = local_60;
LAB_001576c0:
    hint_00 = hint->parent;
    if (hint_00 != (PSH_Hint_conflict)0x0) {
      if ((hint_00->flags & 8) == 0) {
        psh_hint_align(hint_00,globals,dimension,glyph);
        iVar18 = hint->org_pos;
        iVar11 = hint->org_len;
      }
      lVar19 = lVar19 * ((iVar18 - ((hint_00->org_len >> 1) + hint_00->org_pos)) + (iVar11 >> 1));
      uVar4 = (hint_00->cur_pos - ((long)((uVar9 >> 0x10) << 0x20) >> 0x21)) +
              (hint_00->cur_len >> 1) +
              (long)(int)((ulong)((lVar19 >> 0x3f) + lVar19 + 0x8000) >> 0x10);
    }
    uVar9 = uVar4;
    if (glyph->do_stem_adjust != '\0') {
      if (iVar8 < 0x41) {
        if (iVar8 < 0x20) {
          uVar5 = uVar4 + 0x20 & 0xffffffffffffffc0;
          uVar9 = uVar5;
          if (0 < iVar8) {
            uVar7 = uVar5 - uVar4;
            uVar9 = uVar4 + local_60 + 0x20 & 0xffffffffffffffc0;
            uVar12 = uVar9 - (uVar4 + local_60);
            uVar4 = -uVar7;
            if (0 < (long)uVar7) {
              uVar4 = uVar7;
            }
            uVar7 = -uVar12;
            if (0 < (long)uVar12) {
              uVar7 = uVar12;
            }
            if (uVar4 <= uVar7) {
              uVar9 = uVar5;
            }
          }
        }
        else {
          uVar9 = local_60 >> 1;
          local_60 = 0x40;
          uVar9 = uVar4 + uVar9 & 0xffffffffffffffc0;
        }
      }
      else {
        uVar4 = globals->dimension[(uint)dimension].stdw.widths[0].cur;
        uVar7 = local_60 - uVar4;
        uVar5 = -uVar7;
        if (0 < (long)uVar7) {
          uVar5 = uVar7;
        }
        uVar7 = 0x30;
        if (0x30 < (long)uVar4) {
          uVar7 = uVar4;
        }
        if (uVar5 < 0x28) {
          local_60 = uVar7;
        }
        if ((long)local_60 < 0xc0) {
          uVar6 = (uint)local_60 & 0x3f;
          if (9 < uVar6) {
            if (uVar6 < 0x20) {
              local_60 = local_60 & 0x7fffffffffffffc0 | 10;
            }
            else if (uVar6 < 0x36) {
              local_60 = local_60 & 0x7fffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          local_60 = local_60 + 0x20 & 0x7fffffffffffffc0;
        }
      }
    }
    uVar7 = (uVar9 + 0x20 & 0xffffffffffffffc0) - uVar9;
    uVar4 = ((uVar9 + 0x20 + local_60 & 0xffffffffffffffc0) - uVar9) - local_60;
    uVar5 = -uVar7;
    if (0 < (long)uVar7) {
      uVar5 = uVar7;
    }
    uVar12 = -uVar4;
    if (0 < (long)uVar4) {
      uVar12 = uVar4;
    }
    if (uVar5 <= uVar12) {
      uVar4 = uVar7;
    }
    lVar19 = uVar4 + uVar9;
    hint->cur_pos = lVar19;
    hint->cur_len = local_60;
    if (bVar21) {
      uVar4 = 0x40;
      if (0x3f < (long)local_60) {
        uVar4 = local_60 + 0x20 & 0x7fffffffffffffc0;
      }
      uVar9 = uVar4 >> 1;
      if ((uVar4 & 0x40) == 0) {
        uVar5 = lVar19 + uVar9 + 0x20 & 0xffffffffffffffc0;
      }
      else {
        uVar5 = lVar19 + uVar9 & 0xffffffffffffffc0 | 0x20;
      }
      hint->cur_pos = uVar5 - uVar9;
LAB_00157a8c:
      hint->cur_len = uVar4;
    }
  }
  FVar13 = hint->flags;
LAB_00157a94:
  hint->flags = FVar13 | 8;
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             hint->org_pos + hint->org_len,
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }